

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_extension_frame(nghttp2_session *session)

{
  int iVar1;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  int rv;
  nghttp2_session *session_local;
  
  session_local._4_4_ = session_call_unpack_extension_callback(session);
  iVar1 = nghttp2_is_fatal(session_local._4_4_);
  if (iVar1 == 0) {
    if (session_local._4_4_ == 0) {
      session_local._4_4_ = session_call_on_frame_received(session,&(session->iframe).frame);
    }
    else {
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int session_process_extension_frame(nghttp2_session *session) {
  int rv;
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;

  rv = session_call_unpack_extension_callback(session);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  /* This handles the case where rv == NGHTTP2_ERR_CANCEL as well */
  if (rv != 0) {
    return 0;
  }

  return session_call_on_frame_received(session, frame);
}